

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int BuildMapUaToAa(TIFFRGBAImage *img)

{
  uint8_t *puVar1;
  ushort local_24;
  ushort local_22;
  uint16_t nv;
  uint8_t *puStack_20;
  uint16_t na;
  uint8_t *m;
  TIFFRGBAImage *img_local;
  
  if (img->UaToAa == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)_TIFFmallocExt(img->tif,0x10000);
    img->UaToAa = puVar1;
    if (img->UaToAa == (uint8_t *)0x0) {
      TIFFErrorExtR(img->tif,"BuildMapUaToAa","Out of memory");
      img_local._4_4_ = 0;
    }
    else {
      puStack_20 = img->UaToAa;
      for (local_22 = 0; local_22 < 0x100; local_22 = local_22 + 1) {
        for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
          *puStack_20 = (uint8_t)((long)(int)((uint)local_24 * (uint)local_22 + 0x7f) / 0xff);
          puStack_20 = puStack_20 + 1;
        }
      }
      img_local._4_4_ = 1;
    }
    return img_local._4_4_;
  }
  __assert_fail("img->UaToAa == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_getimage.c"
                ,0xc50,"int BuildMapUaToAa(TIFFRGBAImage *)");
}

Assistant:

static int BuildMapUaToAa(TIFFRGBAImage *img)
{
    static const char module[] = "BuildMapUaToAa";
    uint8_t *m;
    uint16_t na, nv;
    assert(img->UaToAa == NULL);
    img->UaToAa = _TIFFmallocExt(img->tif, 65536);
    if (img->UaToAa == NULL)
    {
        TIFFErrorExtR(img->tif, module, "Out of memory");
        return (0);
    }
    m = img->UaToAa;
    for (na = 0; na < 256; na++)
    {
        for (nv = 0; nv < 256; nv++)
            *m++ = (uint8_t)((nv * na + 127) / 255);
    }
    return (1);
}